

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O1

Node * __thiscall
mapbox::detail::Earcut<long>::
linkedList<std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>>
          (Earcut<long> *this,
          vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
          *points,bool clockwise)

{
  pointer pMVar1;
  pointer pMVar2;
  Node *pNVar3;
  Node *last;
  long lVar4;
  bool bVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  
  pMVar1 = (points->
           super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pMVar2 = (points->
           super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar9 = (long)pMVar2 - (long)pMVar1 >> 4;
  if (pMVar2 == pMVar1) {
    bVar5 = true;
  }
  else {
    lVar4 = lVar9 + -1;
    if (lVar9 == 0) {
      lVar4 = 0;
    }
    pdVar6 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data
             .array + 1;
    dVar10 = 0.0;
    lVar8 = 0;
    do {
      dVar10 = dVar10 + (*pdVar6 +
                        pMVar1[lVar4].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                        m_storage.m_data.array[1]) *
                        (pMVar1[lVar4].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                         m_storage.m_data.array[0] -
                        ((plain_array<double,_2,_1,_16> *)(pdVar6 + -1))->array[0]);
      lVar7 = lVar8 + 1;
      pdVar6 = pdVar6 + 2;
      lVar4 = lVar8;
      lVar8 = lVar7;
    } while (lVar9 + (ulong)(lVar9 == 0) != lVar7);
    bVar5 = dVar10 <= 0.0;
  }
  if (bVar5 == clockwise) {
    if (pMVar2 != pMVar1) {
      last = (Node *)0x0;
      lVar8 = lVar9 << 4;
      lVar4 = lVar9;
      do {
        lVar4 = lVar4 + -1;
        last = insertNode<Eigen::Matrix<double,1,2,1,1,2>>
                         (this,this->vertices + lVar4,
                          (Matrix<double,_1,_2,_1,_1,_2> *)
                          ((long)&(points->
                                  super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[-1].
                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                                  m_storage.m_data + lVar8),last);
        lVar8 = lVar8 + -0x10;
      } while (lVar4 != 0);
      goto LAB_001e4d9c;
    }
  }
  else if (pMVar2 != pMVar1) {
    lVar8 = 0;
    lVar4 = 0;
    last = (Node *)0x0;
    do {
      last = insertNode<Eigen::Matrix<double,1,2,1,1,2>>
                       (this,this->vertices + lVar4,
                        (Matrix<double,_1,_2,_1,_1,_2> *)
                        ((long)&(((points->
                                  super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->
                                super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).
                                m_storage.m_data + lVar8),last);
      lVar4 = lVar4 + 1;
      lVar8 = lVar8 + 0x10;
    } while (lVar9 + (ulong)(lVar9 == 0) != lVar4);
    goto LAB_001e4d9c;
  }
  last = (Node *)0x0;
LAB_001e4d9c:
  if (last == (Node *)0x0) {
    last = (Node *)0x0;
  }
  else {
    pNVar3 = last->next;
    if ((last->x == pNVar3->x) && (!NAN(last->x) && !NAN(pNVar3->x))) {
      if ((last->y == pNVar3->y) && (!NAN(last->y) && !NAN(pNVar3->y))) {
        pNVar3->prev = last->prev;
        last->prev->next = pNVar3;
        pNVar3 = last->prevZ;
        if (pNVar3 != (Node *)0x0) {
          pNVar3->nextZ = last->nextZ;
        }
        if (last->nextZ != (Node *)0x0) {
          last->nextZ->prevZ = pNVar3;
        }
        last = last->next;
      }
    }
  }
  this->vertices = this->vertices + lVar9;
  return last;
}

Assistant:

typename Earcut<N>::Node*
Earcut<N>::linkedList(const Ring& points, const bool clockwise) {
    using Point = typename Ring::value_type;
    double sum = 0;
    const std::size_t len = points.size();
    std::size_t i, j;
    Node* last = nullptr;

    // calculate original winding order of a polygon ring
    for (i = 0, j = len > 0 ? len - 1 : 0; i < len; j = i++) {
        const auto& p1 = points[i];
        const auto& p2 = points[j];
        const double p20 = util::nth<0, Point>::get(p2);
        const double p10 = util::nth<0, Point>::get(p1);
        const double p11 = util::nth<1, Point>::get(p1);
        const double p21 = util::nth<1, Point>::get(p2);
        sum += (p20 - p10) * (p11 + p21);
    }

    // link points into circular doubly-linked list in the specified winding order
    if (clockwise == (sum > 0)) {
        for (i = 0; i < len; i++) last = insertNode(vertices + i, points[i], last);
    } else {
        for (i = len; i-- > 0;) last = insertNode(vertices + i, points[i], last);
    }

    if (last && equals(last, last->next)) {
        removeNode(last);
        last = last->next;
    }

    vertices += len;

    return last;
}